

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall
Catch::CompactReporter::assertionEnded(CompactReporter *this,AssertionStats *_assertionStats)

{
  OfType OVar1;
  ostream *poVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  Code colour;
  string *this_00;
  long in_FS_OFFSET;
  allocator local_a1;
  AssertionPrinter printer;
  Colour colourGuard;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (*(((this->super_StreamingReporterBase<Catch::CompactReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[5])();
  bVar4 = true;
  if (((char)iVar3 == '\0') &&
     ((OVar1 = (_assertionStats->assertionResult).m_resultData.resultType,
      (OVar1 & FailureBit) == Ok ||
      (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)))) {
    bVar5 = false;
    bVar4 = false;
    if (OVar1 != Warning) goto LAB_001840ea;
  }
  printer.result = &_assertionStats->assertionResult;
  printer.stream = (this->super_StreamingReporterBase<Catch::CompactReporter>).stream;
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&printer.messages,&_assertionStats->infoMessages);
  printer.itMessage._M_current =
       (_assertionStats->infoMessages).
       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  colourGuard.m_moved = false;
  colour = FileName;
  printer.printInfoMessages = bVar4;
  Colour::use(FileName);
  poVar2 = printer.stream;
  local_48._M_dataplus._M_p = ((printer.result)->m_info).lineInfo.file;
  local_48._M_string_length = ((printer.result)->m_info).lineInfo.line;
  Catch::operator<<(printer.stream,(SourceLineInfo *)&local_48);
  std::operator<<(poVar2,':');
  Colour::~Colour(&colourGuard);
  printer.itMessage._M_current =
       printer.messages.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  OVar1 = ((printer.result)->m_resultData).resultType;
  switch(OVar1) {
  case Ok:
    std::__cxx11::string::string((string *)&local_48,"passed",(allocator *)&colourGuard);
    anon_unknown_1::AssertionPrinter::printResultType(&printer,BrightGreen,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    anon_unknown_1::AssertionPrinter::printOriginalExpression(&printer);
    anon_unknown_1::AssertionPrinter::printReconstructedExpression(&printer);
    colour = FileName;
    if (((printer.result)->m_info).capturedExpression.m_size == 0) {
      colour = None;
    }
    goto LAB_001840ca;
  case Info:
    std::__cxx11::string::string((string *)&local_48,"info",(allocator *)&colourGuard);
    anon_unknown_1::AssertionPrinter::printResultType(&printer,None,&local_48);
    break;
  case Warning:
    std::__cxx11::string::string((string *)&local_48,"warning",(allocator *)&colourGuard);
    anon_unknown_1::AssertionPrinter::printResultType(&printer,None,&local_48);
    break;
  case Unknown:
switchD_00183deb_caseD_ffffffff:
    std::__cxx11::string::string
              ((string *)&local_48,"** internal error **",(allocator *)&colourGuard);
    anon_unknown_1::AssertionPrinter::printResultType(&printer,BrightRed,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    goto LAB_001840d6;
  default:
    if (OVar1 == FailureBit) goto switchD_00183deb_caseD_ffffffff;
    if (OVar1 != ExpressionFailed) {
      if (OVar1 == ExplicitFailure) {
        std::__cxx11::string::string((string *)&local_48,"failed",(allocator *)&colourGuard);
        anon_unknown_1::AssertionPrinter::printResultType(&printer,BrightRed,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::string((string *)&local_48,"explicitly",(allocator *)&colourGuard);
        anon_unknown_1::AssertionPrinter::printIssue(&printer,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        colour = None;
        goto LAB_001840ca;
      }
      if (OVar1 == Exception) goto switchD_00183deb_caseD_ffffffff;
      if (OVar1 == ThrewException) {
        std::__cxx11::string::string((string *)&local_48,"failed",(allocator *)&colourGuard);
        anon_unknown_1::AssertionPrinter::printResultType(&printer,BrightRed,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::string
                  ((string *)&local_48,"unexpected exception with message:",
                   (allocator *)&colourGuard);
        anon_unknown_1::AssertionPrinter::printIssue(&printer,&local_48);
LAB_00183fa9:
        std::__cxx11::string::~string((string *)&local_48);
        anon_unknown_1::AssertionPrinter::printMessage(&printer);
LAB_00184020:
        anon_unknown_1::AssertionPrinter::printExpressionWas(&printer);
        goto LAB_001840ca;
      }
      if (OVar1 == DidntThrowException) {
        std::__cxx11::string::string((string *)&local_48,"failed",(allocator *)&colourGuard);
        anon_unknown_1::AssertionPrinter::printResultType(&printer,BrightRed,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::string
                  ((string *)&local_48,"expected exception, got none",(allocator *)&colourGuard);
        anon_unknown_1::AssertionPrinter::printIssue(&printer,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        goto LAB_00184020;
      }
      if (OVar1 == FatalErrorCondition) {
        std::__cxx11::string::string((string *)&local_48,"failed",(allocator *)&colourGuard);
        anon_unknown_1::AssertionPrinter::printResultType(&printer,BrightRed,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::string
                  ((string *)&local_48,"fatal error condition with message:",
                   (allocator *)&colourGuard);
        anon_unknown_1::AssertionPrinter::printIssue(&printer,&local_48);
        goto LAB_00183fa9;
      }
      goto LAB_001840d6;
    }
    if ((((printer.result)->m_info).resultDisposition & SuppressFail) == 0) {
      std::__cxx11::string::string((string *)&local_48,"failed",(allocator *)&colourGuard);
      anon_unknown_1::AssertionPrinter::printResultType(&printer,BrightRed,&local_48);
      this_00 = &local_48;
    }
    else {
      std::__cxx11::string::string((string *)&colourGuard," - but was ok",&local_a1);
      std::operator+(&local_48,"failed",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &colourGuard);
      anon_unknown_1::AssertionPrinter::printResultType(&printer,BrightGreen,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      this_00 = (string *)&colourGuard;
    }
    std::__cxx11::string::~string((string *)this_00);
    anon_unknown_1::AssertionPrinter::printOriginalExpression(&printer);
    anon_unknown_1::AssertionPrinter::printReconstructedExpression(&printer);
    goto LAB_001840ca;
  }
  std::__cxx11::string::~string((string *)&local_48);
  anon_unknown_1::AssertionPrinter::printMessage(&printer);
LAB_001840ca:
  anon_unknown_1::AssertionPrinter::printRemainingMessages(&printer,colour);
LAB_001840d6:
  std::endl<char,std::char_traits<char>>
            ((this->super_StreamingReporterBase<Catch::CompactReporter>).stream);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            (&printer.messages);
  bVar5 = true;
LAB_001840ea:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool CompactReporter::assertionEnded( AssertionStats const& _assertionStats ) {
            AssertionResult const& result = _assertionStats.assertionResult;

            bool printInfoMessages = true;

            // Drop out if result was successful and we're not printing those
            if( !m_config->includeSuccessfulResults() && result.isOk() ) {
                if( result.getResultType() != ResultWas::Warning )
                    return false;
                printInfoMessages = false;
            }

            AssertionPrinter printer( stream, _assertionStats, printInfoMessages );
            printer.print();

            stream << std::endl;
            return true;
        }